

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeChecker.cc
# Opt level: O0

void __thiscall mcc::TypeChecker::Visit(TypeChecker *this,While *while_stmt)

{
  ErrorReporter *this_00;
  bool bVar1;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  allocator<char> local_39;
  string local_38;
  While *local_18;
  While *while_stmt_local;
  TypeChecker *this_local;
  
  local_18 = while_stmt;
  while_stmt_local = (While *)this;
  peVar2 = std::__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Expr,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &while_stmt->condition_);
  (*peVar2->_vptr_Expr[2])(peVar2,this);
  peVar3 = std::__shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                     (&(local_18->condition_).
                       super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>);
  bVar1 = IsIntegerType(peVar3);
  if (!bVar1) {
    peVar3 = std::__shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>::get
                       (&(local_18->condition_).
                         super___shared_ptr<mcc::Expr,_(__gnu_cxx::_Lock_policy)2>);
    bVar1 = IsPointer(peVar3);
    if (!bVar1) {
      this_00 = this->reporter_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_38,"Used not-scalar where scalar is required",&local_39);
      ErrorReporter::Report(this_00,&local_38,&(local_18->super_Stmt).token_);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator(&local_39);
      return;
    }
  }
  peVar4 = std::__shared_ptr_access<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<mcc::Stmt,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &local_18->loop_block_);
  (*peVar4->_vptr_Stmt[2])(peVar4,this);
  return;
}

Assistant:

void TypeChecker::Visit(While& while_stmt) {
  while_stmt.condition_->Accept(*this);

  if (!IsIntegerType(while_stmt.condition_.get()) && !IsPointer(while_stmt.condition_.get())) {
    reporter_.Report("Used not-scalar where scalar is required", while_stmt.token_);
    return;
  }

  while_stmt.loop_block_->Accept(*this);
}